

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idaSlCrank_dns.c
# Opt level: O1

int main(void)

{
  uint uVar1;
  int iVar2;
  UserData data;
  N_Vector yy;
  N_Vector yp;
  long *plVar3;
  long lVar4;
  long lVar5;
  char *pcVar6;
  int iVar7;
  N_Vector y;
  undefined4 uVar8;
  undefined4 extraout_XMM0_Da;
  undefined4 uVar9;
  undefined4 extraout_XMM0_Db;
  void *mem;
  SUNContext ctx;
  sunrealtype tret;
  N_Vector local_58;
  undefined8 local_50;
  long local_48;
  long *local_40;
  sunrealtype local_38;
  
  uVar1 = SUNContext_Create(0,&local_50);
  if ((int)uVar1 < 0) {
    pcVar6 = "SUNContext_Create";
  }
  else {
    data = (UserData)malloc(0x40);
    data->a = 0.5;
    data->J1 = 1.0;
    data->J2 = 2.0;
    data->m2 = 1.0;
    *(undefined4 *)&data->k = 0;
    *(undefined4 *)((long)&data->k + 4) = 0x3ff00000;
    *(undefined4 *)&data->c = 0;
    *(undefined4 *)((long)&data->c + 4) = 0x3ff00000;
    *(undefined4 *)&data->l0 = 0;
    *(undefined4 *)((long)&data->l0 + 4) = 0x3ff00000;
    *(undefined4 *)&data->F = 0;
    *(undefined4 *)((long)&data->F + 4) = 0x3ff00000;
    yy = (N_Vector)N_VNew_Serial(10,local_50);
    yp = (N_Vector)N_VClone(yy);
    plVar3 = (long *)N_VClone(yy);
    setIC(yy,yp,data);
    N_VConst(0,plVar3);
    lVar4 = *(long *)(*plVar3 + 0x10);
    *(undefined8 *)(lVar4 + 0x40) = 0;
    *(undefined8 *)(lVar4 + 0x48) = 0;
    *(undefined8 *)(lVar4 + 0x30) = 0;
    *(undefined8 *)(lVar4 + 0x38) = 0;
    local_58 = (N_Vector)IDACreate(local_50);
    IDAInit(0,local_58,ressc,yy,yp);
    uVar8 = 0xa0b5ed8d;
    uVar9 = 0x3eb0c6f7;
    IDASStolerances(local_58);
    IDASetUserData(local_58,data);
    IDASetId(local_58,plVar3);
    IDASetSuppressAlg(local_58,1);
    lVar4 = SUNDenseMatrix(10,10,local_50);
    if (lVar4 == 0) {
      main_cold_2();
      return 1;
    }
    lVar5 = SUNLinSol_Dense(yy,lVar4,local_50);
    if (lVar5 == 0) {
      main_cold_1();
      return 1;
    }
    y = local_58;
    uVar1 = IDASetLinearSolver(local_58,lVar5,lVar4);
    if (-1 < (int)uVar1) {
      local_48 = lVar5;
      local_40 = plVar3;
      PrintHeader((sunrealtype)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da),
                  (sunrealtype)CONCAT44(uVar9,uVar8),y);
      PrintOutput(local_58,0.0,yy);
      iVar7 = 1;
      do {
        iVar2 = IDASolve(SUB84((double)iVar7 * 0.25,0),local_58,&local_38,yy,yp,1);
        if (iVar2 < 0) break;
        PrintOutput(local_58,local_38,yy);
        iVar7 = iVar7 + 1;
      } while (iVar7 != 0x29);
      PrintFinalStats(local_58);
      free(data);
      IDAFree(&local_58);
      SUNLinSolFree(local_48);
      SUNMatDestroy(lVar4);
      N_VDestroy(yy);
      N_VDestroy(yp);
      N_VDestroy(local_40);
      SUNContext_Free(&local_50);
      return 0;
    }
    pcVar6 = "IDASetLinearSolver";
  }
  fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n",pcVar6,(ulong)uVar1);
  return 1;
}

Assistant:

int main(void)
{
  UserData data;

  void* mem;
  N_Vector yy, yp, id;
  sunrealtype rtol, atol;
  sunrealtype t0, tf, tout, dt, tret;
  int retval, iout;
  SUNMatrix A;
  SUNLinearSolver LS;
  SUNContext ctx;

  A  = NULL;
  LS = NULL;

  /* Create the SUNDIALS context object for this simulation */
  retval = SUNContext_Create(SUN_COMM_NULL, &ctx);
  if (check_retval(&retval, "SUNContext_Create", 1)) { return 1; }

  /* User data */

  data = (UserData)malloc(sizeof *data);

  data->a  = 0.5; /* half-length of crank */
  data->J1 = 1.0; /* crank moment of inertia */
  data->m2 = 1.0; /* mass of connecting rod */
  data->J2 = 2.0; /* moment of inertia of connecting rod */
  data->k  = 1.0; /* spring constant */
  data->c  = 1.0; /* damper constant */
  data->l0 = 1.0; /* spring free length */
  data->F  = 1.0; /* external constant force */

  /* Create N_Vectors */
  yy = N_VNew_Serial(NEQ, ctx);
  yp = N_VClone(yy);
  id = N_VClone(yy);

  /* Consistent IC */
  setIC(yy, yp, data);

  /* ID array */
  N_VConst(ONE, id);
  NV_Ith_S(id, 6) = ZERO;
  NV_Ith_S(id, 7) = ZERO;
  NV_Ith_S(id, 8) = ZERO;
  NV_Ith_S(id, 9) = ZERO;

  /* Tolerances */
  rtol = SUN_RCONST(1.0e-6);
  atol = SUN_RCONST(1.0e-6);

  /* Integration limits */
  t0 = ZERO;
  tf = TEND;
  dt = (tf - t0) / (NOUT - 1);

  /* IDA initialization */
  mem    = IDACreate(ctx);
  retval = IDAInit(mem, ressc, t0, yy, yp);
  retval = IDASStolerances(mem, rtol, atol);
  retval = IDASetUserData(mem, data);
  retval = IDASetId(mem, id);
  retval = IDASetSuppressAlg(mem, SUNTRUE);

  /* Create dense SUNMatrix for use in linear solves */
  A = SUNDenseMatrix(NEQ, NEQ, ctx);
  if (check_retval((void*)A, "SUNDenseMatrix", 0)) { return (1); }

  /* Create dense SUNLinearSolver object */
  LS = SUNLinSol_Dense(yy, A, ctx);
  if (check_retval((void*)LS, "SUNLinSol_Dense", 0)) { return (1); }

  /* Attach the matrix and linear solver */
  retval = IDASetLinearSolver(mem, LS, A);
  if (check_retval(&retval, "IDASetLinearSolver", 1)) { return (1); }

  PrintHeader(rtol, atol, yy);

  /* In loop, call IDASolve, print results, and test for error. */

  retval = PrintOutput(mem, t0, yy);

  tout = dt;
  for (iout = 1; iout < NOUT; iout++)
  {
    tout   = iout * dt;
    retval = IDASolve(mem, tout, &tret, yy, yp, IDA_NORMAL);
    if (retval < 0) { break; }

    retval = PrintOutput(mem, tret, yy);
  }

  retval = PrintFinalStats(mem);

  /* Free memory */

  free(data);
  IDAFree(&mem);
  SUNLinSolFree(LS);
  SUNMatDestroy(A);
  N_VDestroy(yy);
  N_VDestroy(yp);
  N_VDestroy(id);
  SUNContext_Free(&ctx);

  return (0);
}